

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O1

void asio::detail::
     reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ptr p;
  handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor,_void>
  w;
  ptr local_128;
  any_executor_base local_110;
  func_type local_e0;
  undefined1 local_d8 [40];
  error_code local_b0;
  func_type local_a0;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *local_98;
  scheduler_operation *local_90;
  func_type p_Stack_88;
  size_t local_80;
  int local_78;
  func_type local_70;
  undefined8 uStack_68;
  scheduler_operation *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  scheduler_operation *local_40;
  error_category *peStack_38;
  scheduler_operation *local_30;
  
  local_128.h = (io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
                 *)(base + 4);
  local_128.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor>
                 *)base;
  local_128.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor>
                 *)base;
  execution::detail::any_executor_base::any_executor_base
            (&local_110,(any_executor_base *)&base[10].func_);
  local_e0 = base[0xc].func_;
  base[0xc].func_ =
       (func_type)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_d8._0_8_ = base[4].next_;
  local_d8._8_8_ = base[4].func_;
  local_128.h = (io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
                 *)local_d8;
  local_d8._16_8_ = *(undefined8 *)&base[4].task_result_;
  local_d8._24_8_ = base[5].next_;
  local_d8._32_8_ = base[5].func_;
  local_b0._M_value = base[5].task_result_;
  local_b0._4_4_ = *(undefined4 *)&base[5].field_0x14;
  local_b0._M_cat = (error_category *)base[6].next_;
  local_a0 = base[6].func_;
  local_98 = *(stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> **)
              &base[6].task_result_;
  local_90 = base[7].next_;
  p_Stack_88 = base[7].func_;
  local_80 = *(size_t *)&base[7].task_result_;
  local_78 = *(int *)&base[8].next_;
  local_70 = base[8].func_;
  uStack_68._0_4_ = base[8].task_result_;
  uStack_68._4_4_ = *(undefined4 *)&base[8].field_0x14;
  local_60 = base[9].next_;
  _Stack_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[9].func_;
  base[9].func_ = (func_type)0x0;
  base[9].next_ = (scheduler_operation *)0x0;
  local_50 = *(element_type **)&base[9].task_result_;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[10].next_;
  base[10].next_ = (scheduler_operation *)0x0;
  *(undefined8 *)&base[9].task_result_ = 0;
  local_40 = base[1].next_;
  peStack_38 = (error_category *)base[1].func_;
  local_30 = base[2].next_;
  ptr::reset(&local_128);
  if (owner != (void *)0x0) {
    handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>>,asio::any_io_executor,void>
    ::
    complete<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>>,std::error_code,unsigned_long>>
              ((handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>>,asio::any_io_executor,void>
                *)&local_110,
               (binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>
                *)local_d8,
               (io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
                *)local_d8);
  }
  if ((scheduler_operation *)_Stack_48._M_pi != (scheduler_operation *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_48._M_pi);
  }
  if (_Stack_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_58._M_pi);
  }
  (*(local_110.object_fns_)->destroy)(&local_110);
  ptr::reset(&local_128);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_recv_op* o(static_cast<reactive_socket_recv_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }